

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall NTrodeObj::NTrodeObj(NTrodeObj *this)

{
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__NTrodeObj_005d6258;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x351dac);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"");
  return;
}

Assistant:

NTrodeObj::NTrodeObj() : NetworkDataType() {
    id = "";
}